

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O3

bool __thiscall
ON_Extrusion::IsContinuous
          (ON_Extrusion *this,continuity c,double s,double t,int *hint,double point_tolerance,
          double d1_tolerance,double d2_tolerance,double cos_angle_tolerance,
          double curvature_tolerance)

{
  ON_Curve *pOVar1;
  int iVar2;
  int *piVar3;
  undefined4 uVar4;
  
  uVar4 = SUB84(s,0);
  pOVar1 = this->m_profile;
  if (pOVar1 != (ON_Curve *)0x0) {
    piVar3 = hint + 1;
    if (hint == (int *)0x0) {
      piVar3 = hint;
    }
    if (this->m_bTransposed == false) {
      uVar4 = SUB84(t,0);
      hint = piVar3;
    }
    iVar2 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x37])
                      (uVar4,SUB84(point_tolerance,0),SUB84(d1_tolerance,0),SUB84(d2_tolerance,0),
                       SUB84(cos_angle_tolerance,0),SUB84(curvature_tolerance,0),pOVar1,c,hint);
    return SUB41(iVar2,0);
  }
  return false;
}

Assistant:

bool ON_Extrusion::IsContinuous(
  ON::continuity c,
  double s, 
  double t, 
  int* hint,
  double point_tolerance,
  double d1_tolerance,
  double d2_tolerance,
  double cos_angle_tolerance,
  double curvature_tolerance
  ) const
{
  if ( !m_profile )
    return false;
  int* crv_hint = 0;
  double curvet;
  if ( m_bTransposed )
  {
    curvet = s;
    crv_hint = hint;
  }
  else
  {
    curvet = t;
    crv_hint = hint ? hint+1 : 0;
  }
  return m_profile->IsContinuous(c,curvet,crv_hint,point_tolerance,d1_tolerance,d2_tolerance,cos_angle_tolerance,curvature_tolerance);
}